

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int m_select_code_option(aec_stream *strm)

{
  int iVar1;
  internal_state *piVar2;
  uint8_t *puVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  code *pcVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  internal_state *state;
  int iVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  ulong uVar23;
  
  piVar2 = strm->state;
  iVar16 = piVar2->id_len;
  uVar14 = strm->block_size;
  uVar20 = (ulong)uVar14;
  if (iVar16 < 2) {
    uVar14 = 0xffffffff;
  }
  else {
    iVar17 = uVar14 - piVar2->ref;
    iVar1 = piVar2->k;
    bVar22 = false;
    iVar7 = iVar1;
    bVar4 = iVar1 == 0;
    iVar11 = iVar1;
    uVar18 = 0xffffffffffffffff;
    do {
      do {
        while( true ) {
          while( true ) {
            bVar6 = bVar4;
            iVar5 = iVar7;
            if (uVar14 == 0) {
              uVar15 = 0;
            }
            else {
              uVar21 = 0;
              uVar15 = 0;
              do {
                uVar15 = uVar15 + (piVar2->block[uVar21] >> ((byte)iVar5 & 0x1f));
                uVar21 = uVar21 + 1;
              } while (uVar20 != uVar21);
            }
            uVar21 = (long)((iVar5 + 1) * iVar17) + uVar15;
            if (uVar21 < uVar18) break;
            bVar22 = true;
            iVar7 = iVar1 + -1;
            bVar4 = true;
            if (bVar6) goto LAB_00101996;
          }
          if (uVar18 != 0xffffffffffffffff) {
            bVar6 = true;
          }
          uVar18 = uVar21;
          iVar11 = iVar5;
          bVar4 = bVar6;
          if (!bVar22) break;
          if ((iVar5 == 0) || ((ulong)(long)iVar17 <= uVar15)) goto LAB_00101996;
          bVar22 = true;
          iVar7 = iVar5 + -1;
        }
      } while (((ulong)(long)iVar17 <= uVar15) &&
              (bVar22 = false, iVar7 = iVar5 + 1, iVar5 < piVar2->kmax));
      bVar22 = true;
      iVar7 = iVar1 + -1;
      bVar4 = true;
    } while (!bVar6);
LAB_00101996:
    uVar14 = (uint)uVar18;
    piVar2->k = iVar11;
  }
  uVar10 = piVar2->uncomp_len;
  if (uVar20 == 0) {
    uVar18 = 1;
  }
  else {
    uVar18 = 1;
    uVar15 = 0;
    do {
      uVar21 = (ulong)piVar2->block[uVar15];
      uVar23 = (ulong)piVar2->block[uVar15 + 1];
      uVar18 = uVar18 + uVar23 + ((uVar21 + uVar23 + 1) * (uVar23 + uVar21) >> 1) + 1;
      if (uVar10 < uVar18) {
        uVar18 = 0xffffffff;
        break;
      }
      uVar15 = uVar15 + 2;
    } while (uVar15 < uVar20);
  }
  if (uVar14 < uVar10) {
    if ((uint)uVar18 <= uVar14) {
LAB_00101a62:
      m_encode_se(strm);
      return 1;
    }
    iVar1 = piVar2->bits;
    uVar14 = piVar2->k;
    uVar10 = uVar14 + 1;
    if (iVar1 < iVar16) {
      uVar8 = iVar16 - iVar1;
      puVar3 = piVar2->cds;
      piVar2->cds = puVar3 + 1;
      *puVar3 = *puVar3 + (char)(uVar10 >> ((byte)uVar8 & 0x3f));
      uVar9 = uVar8;
      if (8 < (int)uVar8) {
        do {
          uVar8 = uVar9 - 8;
          puVar3 = piVar2->cds;
          piVar2->cds = puVar3 + 1;
          *puVar3 = (uint8_t)(uVar10 >> ((byte)uVar8 & 0x1f));
          bVar4 = 0x10 < uVar9;
          uVar9 = uVar8;
        } while (bVar4);
      }
      piVar2->bits = 8 - uVar8;
      *piVar2->cds = (uint8_t)(uVar10 << ((byte)(8 - uVar8) & 0x1f));
    }
    else {
      piVar2->bits = iVar1 - iVar16;
      *piVar2->cds = *piVar2->cds + (char)(uVar10 << ((byte)(iVar1 - iVar16) & 0x1f));
    }
    if (piVar2->ref != 0) {
      iVar16 = piVar2->bits;
      uVar8 = piVar2->ref_sample;
      uVar10 = strm->bits_per_sample;
      if (iVar16 < (int)uVar10) {
        uVar10 = uVar10 - iVar16;
        puVar3 = piVar2->cds;
        piVar2->cds = puVar3 + 1;
        *puVar3 = *puVar3 + (char)(uVar8 >> ((byte)uVar10 & 0x3f));
        uVar9 = uVar10;
        if (8 < (int)uVar10) {
          do {
            uVar10 = uVar9 - 8;
            puVar3 = piVar2->cds;
            piVar2->cds = puVar3 + 1;
            *puVar3 = (uint8_t)(uVar8 >> ((byte)uVar10 & 0x1f));
            bVar4 = 0x10 < uVar9;
            uVar9 = uVar10;
          } while (bVar4);
        }
        piVar2->bits = 8 - uVar10;
        *piVar2->cds = (uint8_t)(uVar8 << ((byte)(8 - uVar10) & 0x1f));
      }
      else {
        piVar2->bits = iVar16 - uVar10;
        *piVar2->cds = *piVar2->cds + (char)(uVar8 << ((byte)(iVar16 - uVar10) & 0x1f));
      }
    }
    uVar20 = (ulong)piVar2->ref;
    piVar2 = strm->state;
    puVar19 = (ulong *)piVar2->cds;
    uVar18 = (ulong)(byte)*puVar19 << 0x38;
    uVar10 = 7 - piVar2->bits;
    uVar15 = (ulong)strm->block_size;
    if (uVar20 < uVar15) {
      do {
        uVar10 = uVar10 + (piVar2->block[uVar20] >> ((byte)uVar14 & 0x1f)) + 1;
        if (0x3f < uVar10) {
          do {
            *puVar19 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                       (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                       (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                       (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
            puVar19 = (ulong *)(piVar2->cds + 8);
            piVar2->cds = (uint8_t *)puVar19;
            uVar10 = uVar10 - 0x40;
            uVar18 = 0;
          } while (0x3f < uVar10);
          uVar15 = (ulong)strm->block_size;
          uVar18 = 0;
        }
        uVar18 = uVar18 | 1L << ((ulong)(byte)((byte)uVar10 ^ 0x3f) & 0x3f);
        uVar20 = uVar20 + 1;
      } while (uVar20 < uVar15);
    }
    *puVar19 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
               (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
               (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 | (uVar18 & 0xff00) << 0x28
               | uVar18 << 0x38;
    piVar2->cds = piVar2->cds + (uVar10 >> 3);
    piVar2->bits = ~uVar10 & 7;
    if (uVar14 == 0) goto LAB_00101c82;
    uVar10 = strm->block_size;
    iVar16 = (int)strm->state;
  }
  else {
    if ((uint)uVar18 < uVar10) goto LAB_00101a62;
    uVar14 = ~(-1 << ((byte)iVar16 & 0x1f));
    iVar1 = piVar2->bits;
    if (iVar1 < iVar16) {
      uVar10 = iVar16 - iVar1;
      puVar3 = piVar2->cds;
      piVar2->cds = puVar3 + 1;
      *puVar3 = *puVar3 + (char)(uVar14 >> ((byte)uVar10 & 0x3f));
      uVar8 = uVar10;
      if (8 < (int)uVar10) {
        do {
          uVar10 = uVar8 - 8;
          puVar3 = piVar2->cds;
          piVar2->cds = puVar3 + 1;
          *puVar3 = (uint8_t)(uVar14 >> ((byte)uVar10 & 0x1f));
          bVar4 = 0x10 < uVar8;
          uVar8 = uVar10;
        } while (bVar4);
      }
      piVar2->bits = 8 - uVar10;
      *piVar2->cds = (uint8_t)(uVar14 << ((byte)(8 - uVar10) & 0x1f));
    }
    else {
      piVar2->bits = iVar1 - iVar16;
      *piVar2->cds = *piVar2->cds + (char)(uVar14 << ((byte)(iVar1 - iVar16) & 0x1f));
    }
    if (piVar2->ref != 0) {
      *piVar2->block = piVar2->ref_sample;
    }
    uVar14 = strm->bits_per_sample;
    uVar10 = strm->block_size;
    iVar16 = (int)strm->state;
  }
  emitblock((aec_stream *)(ulong)uVar10,iVar16,uVar14);
LAB_00101c82:
  piVar2 = strm->state;
  if (piVar2->direct_out == 0) {
    piVar2->i = 0;
    pcVar13 = m_flush_block_resumable;
  }
  else {
    lVar12 = (long)(*(int *)&piVar2->cds - (int)strm->next_out);
    strm->next_out = strm->next_out + lVar12;
    strm->avail_out = strm->avail_out - lVar12;
    pcVar13 = m_get_block;
  }
  piVar2->mode = pcVar13;
  return 1;
}

Assistant:

static int m_select_code_option(struct aec_stream *strm)
{
    /**
       Decide which code option to use.
    */

    uint32_t split_len;
    uint32_t se_len;
    struct internal_state *state = strm->state;

    if (state->id_len > 1)
        split_len = assess_splitting_option(strm);
    else
        split_len = UINT32_MAX;
    se_len = assess_se_option(strm);

    if (split_len < state->uncomp_len) {
        if (split_len < se_len)
            return m_encode_splitting(strm);
        else
            return m_encode_se(strm);
    } else {
        if (state->uncomp_len <= se_len)
            return m_encode_uncomp(strm);
        else
            return m_encode_se(strm);
    }
}